

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BatchnormLayerParams::MergeFrom
          (BatchnormLayerParams *this,BatchnormLayerParams *from)

{
  float fVar1;
  void *pvVar2;
  LogMessage *other;
  WeightParams *pWVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x7bf4);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if ((from != (BatchnormLayerParams *)&_BatchnormLayerParams_default_instance_) &&
     (from->gamma_ != (WeightParams *)0x0)) {
    if (this->gamma_ == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar3);
      this->gamma_ = pWVar3;
    }
    pWVar3 = from->gamma_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->gamma_,pWVar3);
  }
  if ((from != (BatchnormLayerParams *)&_BatchnormLayerParams_default_instance_) &&
     (from->beta_ != (WeightParams *)0x0)) {
    if (this->beta_ == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar3);
      this->beta_ = pWVar3;
    }
    pWVar3 = from->beta_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->beta_,pWVar3);
  }
  if ((from != (BatchnormLayerParams *)&_BatchnormLayerParams_default_instance_) &&
     (from->mean_ != (WeightParams *)0x0)) {
    if (this->mean_ == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar3);
      this->mean_ = pWVar3;
    }
    pWVar3 = from->mean_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->mean_,pWVar3);
  }
  if ((from != (BatchnormLayerParams *)&_BatchnormLayerParams_default_instance_) &&
     (from->variance_ != (WeightParams *)0x0)) {
    if (this->variance_ == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar3);
      this->variance_ = pWVar3;
    }
    pWVar3 = from->variance_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->variance_,pWVar3);
  }
  if (from->channels_ != 0) {
    this->channels_ = from->channels_;
  }
  if (from->computemeanvar_ == true) {
    this->computemeanvar_ = true;
  }
  if (from->instancenormalization_ == true) {
    this->instancenormalization_ = true;
  }
  fVar1 = from->epsilon_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->epsilon_ = fVar1;
  }
  return;
}

Assistant:

void BatchnormLayerParams::MergeFrom(const BatchnormLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.BatchnormLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_gamma()) {
    mutable_gamma()->::CoreML::Specification::WeightParams::MergeFrom(from.gamma());
  }
  if (from.has_beta()) {
    mutable_beta()->::CoreML::Specification::WeightParams::MergeFrom(from.beta());
  }
  if (from.has_mean()) {
    mutable_mean()->::CoreML::Specification::WeightParams::MergeFrom(from.mean());
  }
  if (from.has_variance()) {
    mutable_variance()->::CoreML::Specification::WeightParams::MergeFrom(from.variance());
  }
  if (from.channels() != 0) {
    set_channels(from.channels());
  }
  if (from.computemeanvar() != 0) {
    set_computemeanvar(from.computemeanvar());
  }
  if (from.instancenormalization() != 0) {
    set_instancenormalization(from.instancenormalization());
  }
  if (from.epsilon() != 0) {
    set_epsilon(from.epsilon());
  }
}